

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txb_rdopt.c
# Opt level: O2

void update_coeff_general
               (int *accu_rate,int64_t *accu_dist,int si,int eob,TX_SIZE tx_size,TX_CLASS tx_class,
               int bhl,int width,int64_t rdmult,int shift,int dc_sign_ctx,int16_t *dequant,
               int16_t *scan,LV_MAP_COEFF_COST *txb_costs,tran_low_t *tcoeff,tran_low_t *qcoeff,
               tran_low_t *dqcoeff,uint8_t *levels,qm_val_t *iqmatrix,qm_val_t *qmatrix)

{
  short sVar1;
  tran_low_t tcoeff_00;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  long lVar9;
  uint8_t uVar10;
  int iVar11;
  uint uVar12;
  int coeff_idx;
  byte *pbVar13;
  long lVar14;
  uint is_last;
  int dqcoeff_00;
  uint abs_qc;
  bool bVar15;
  ulong local_70;
  
  sVar1 = scan[si];
  coeff_idx = (int)sVar1;
  iVar2 = get_dqv(dequant,coeff_idx,iqmatrix);
  iVar4 = qcoeff[sVar1];
  bVar15 = eob + -1 == si;
  bVar7 = (byte)bhl;
  if (bVar15) {
    if (si == 0) {
      uVar8 = 0;
    }
    else {
      iVar11 = width << (bVar7 & 0x1f);
      if (iVar11 >> 3 < si) {
        uVar8 = iVar11 >> 2 < si | 2;
      }
      else {
        uVar8 = 1;
      }
    }
  }
  else {
    iVar11 = coeff_idx >> (bVar7 & 0x1f);
    lVar9 = (long)((int)sVar1 + iVar11 * 4);
    lVar14 = (long)(1 << (bVar7 & 0x1f));
    if (tx_class == '\x02') {
      iVar3 = (uint)""[levels[lVar9 + 3]] + (uint)""[levels[lVar9 + 2]];
      pbVar13 = levels + lVar9 + 4;
    }
    else if (tx_class == '\0') {
      iVar3 = (uint)""[levels[(long)(2 << (bVar7 & 0x1f)) + lVar9 + 8]] +
              (uint)""[levels[lVar14 + lVar9 + 5]];
      pbVar13 = levels + lVar9 + 2;
    }
    else {
      iVar3 = (uint)""[levels[(long)(3 << (bVar7 & 0x1f)) + lVar9 + 0xc]] +
              (uint)""[levels[(long)(2 << (bVar7 & 0x1f)) + lVar9 + 8]];
      pbVar13 = levels + (4 << (bVar7 & 0x1f)) + lVar9 + 0x10;
    }
    uVar8 = 0;
    if (sVar1 != 0 || tx_class != '\0') {
      uVar8 = (uint)""[*pbVar13] +
              (uint)""[levels[lVar9 + 1]] + (uint)""[levels[lVar14 + 4 + lVar9]] + iVar3 + 1 >> 1;
      uVar12 = 4;
      if (uVar8 < 4) {
        uVar12 = uVar8;
      }
      if (tx_class == '\x02') {
        uVar8 = uVar12 + nz_map_ctx_offset_1d[(uint)(~(-1 << (bVar7 & 0x1f)) & (int)sVar1)];
      }
      else {
        if (tx_class == '\x01') {
          iVar11 = nz_map_ctx_offset_1d[iVar11];
        }
        else {
          uVar8 = 0;
          if (tx_class != '\0') goto LAB_0022123e;
          iVar11 = (int)av1_nz_map_ctx_offset[tx_size][sVar1];
        }
        uVar8 = uVar12 + iVar11;
      }
    }
  }
LAB_0022123e:
  if (iVar4 == 0) {
    *accu_rate = *accu_rate + txb_costs->base_cost[(int)uVar8][0];
  }
  else {
    uVar12 = iVar4 >> 0x1f;
    iVar3 = -uVar12;
    iVar11 = -iVar4;
    if (0 < iVar4) {
      iVar11 = iVar4;
    }
    tcoeff_00 = tcoeff[sVar1];
    uVar5 = get_coeff_dist(tcoeff_00,dqcoeff[sVar1],shift,qmatrix,(int)sVar1);
    lVar9 = (long)(tcoeff_00 << ((byte)shift & 0x1f));
    if (qmatrix == (qm_val_t *)0x0) {
      local_70 = lVar9 * lVar9;
    }
    else {
      local_70 = (ulong)qmatrix[sVar1] * lVar9 * (ulong)qmatrix[sVar1] * lVar9 + 0x200 >> 10;
    }
    is_last = (uint)bVar15;
    iVar4 = get_coeff_cost_general
                      (is_last,(int)sVar1,iVar11,iVar3,uVar8,dc_sign_ctx,txb_costs,bhl,tx_class,
                       levels);
    if (iVar11 == 1) {
      iVar2 = txb_costs->base_cost[(int)uVar8][0];
      iVar11 = 0;
      dqcoeff_00 = 0;
      abs_qc = 0;
      uVar6 = local_70;
    }
    else {
      abs_qc = iVar11 - 1;
      iVar11 = (abs_qc ^ uVar12) + iVar3;
      dqcoeff_00 = ((int)(iVar2 * abs_qc) >> ((byte)shift & 0x1f) ^ uVar12) + iVar3;
      uVar6 = get_coeff_dist(tcoeff_00,dqcoeff_00,shift,qmatrix,(int)sVar1);
      iVar2 = get_coeff_cost_general
                        (is_last,coeff_idx,abs_qc,iVar3,uVar8,dc_sign_ctx,txb_costs,bhl,tx_class,
                         levels);
    }
    if ((long)(uVar6 * 0x80 + (iVar2 * rdmult + 0x100 >> 9)) <
        (long)(uVar5 * 0x80 + (iVar4 * rdmult + 0x100 >> 9))) {
      qcoeff[sVar1] = iVar11;
      uVar10 = '\x7f';
      if (abs_qc < 0x7f) {
        uVar10 = (uint8_t)abs_qc;
      }
      dqcoeff[sVar1] = dqcoeff_00;
      levels[(int)sVar1 + ((int)sVar1 >> (bVar7 & 0x1f)) * 4] = uVar10;
      uVar5 = uVar6;
      iVar4 = iVar2;
    }
    lVar9 = *accu_dist;
    *accu_rate = *accu_rate + iVar4;
    *accu_dist = (uVar5 - local_70) + lVar9;
  }
  return;
}

Assistant:

static inline void update_coeff_general(
    int *accu_rate, int64_t *accu_dist, int si, int eob, TX_SIZE tx_size,
    TX_CLASS tx_class, int bhl, int width, int64_t rdmult, int shift,
    int dc_sign_ctx, const int16_t *dequant, const int16_t *scan,
    const LV_MAP_COEFF_COST *txb_costs, const tran_low_t *tcoeff,
    tran_low_t *qcoeff, tran_low_t *dqcoeff, uint8_t *levels,
    const qm_val_t *iqmatrix, const qm_val_t *qmatrix) {
  const int dqv = get_dqv(dequant, scan[si], iqmatrix);
  const int ci = scan[si];
  const tran_low_t qc = qcoeff[ci];
  const int is_last = si == (eob - 1);
  const int coeff_ctx = get_lower_levels_ctx_general(
      is_last, si, bhl, width, levels, ci, tx_size, tx_class);
  if (qc == 0) {
    *accu_rate += txb_costs->base_cost[coeff_ctx][0];
  } else {
    const int sign = (qc < 0) ? 1 : 0;
    const tran_low_t abs_qc = abs(qc);
    const tran_low_t tqc = tcoeff[ci];
    const tran_low_t dqc = dqcoeff[ci];
    const int64_t dist = get_coeff_dist(tqc, dqc, shift, qmatrix, ci);
    const int64_t dist0 = get_coeff_dist(tqc, 0, shift, qmatrix, ci);
    const int rate =
        get_coeff_cost_general(is_last, ci, abs_qc, sign, coeff_ctx,
                               dc_sign_ctx, txb_costs, bhl, tx_class, levels);
    const int64_t rd = RDCOST(rdmult, rate, dist);

    tran_low_t qc_low, dqc_low;
    tran_low_t abs_qc_low;
    int64_t dist_low, rd_low;
    int rate_low;
    if (abs_qc == 1) {
      abs_qc_low = qc_low = dqc_low = 0;
      dist_low = dist0;
      rate_low = txb_costs->base_cost[coeff_ctx][0];
    } else {
      get_qc_dqc_low(abs_qc, sign, dqv, shift, &qc_low, &dqc_low);
      abs_qc_low = abs_qc - 1;
      dist_low = get_coeff_dist(tqc, dqc_low, shift, qmatrix, ci);
      rate_low =
          get_coeff_cost_general(is_last, ci, abs_qc_low, sign, coeff_ctx,
                                 dc_sign_ctx, txb_costs, bhl, tx_class, levels);
    }

    rd_low = RDCOST(rdmult, rate_low, dist_low);
    if (rd_low < rd) {
      qcoeff[ci] = qc_low;
      dqcoeff[ci] = dqc_low;
      levels[get_padded_idx(ci, bhl)] = AOMMIN(abs_qc_low, INT8_MAX);
      *accu_rate += rate_low;
      *accu_dist += dist_low - dist0;
    } else {
      *accu_rate += rate;
      *accu_dist += dist - dist0;
    }
  }
}